

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeParseContentInternal
              (xmlDoc *doc,xmlNodePtr parent,xmlChar *value,int len,xmlNodePtr *listPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  xmlBufPtr buf;
  xmlChar *pxVar4;
  xmlEntityPtr parent_00;
  xmlChar *pxVar5;
  xmlNodePtr pxVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  xmlNodePtr pxVar10;
  uint uVar11;
  int iVar12;
  xmlNodePtr local_70;
  xmlNodePtr local_68;
  xmlNodePtr local_50;
  xmlChar buffer [10];
  
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = (xmlNodePtr)0x0;
  }
  uVar11 = 0x7fffffff;
  if ((uint)len < 0x7fffffff) {
    uVar11 = len;
  }
  if ((value == (xmlChar *)0x0) || (*value == '\0')) {
    pxVar6 = (xmlNodePtr)0x0;
    pxVar10 = (xmlNodePtr)0x0;
LAB_00149993:
    if (parent != (xmlNodePtr)0x0) {
      if (parent->children != (xmlNodePtr)0x0) {
        xmlFreeNodeList(parent->children);
      }
      parent->children = pxVar10;
      parent->last = pxVar6;
    }
    iVar2 = 0;
    if (listPtr != (xmlNodePtr *)0x0) {
      *listPtr = pxVar10;
    }
  }
  else {
    buf = xmlBufCreate(0x32);
    if (buf != (xmlBufPtr)0x0) {
      local_68 = (xmlNodePtr)0x0;
      local_70 = (xmlNodePtr)0x0;
LAB_00149603:
      uVar7 = 0x3b;
      pbVar9 = value;
      while( true ) {
        if (((int)uVar11 < 1) || (*pbVar9 == 0)) goto LAB_001499c5;
        if (*pbVar9 == 0x26) break;
        pbVar9 = pbVar9 + 1;
        uVar11 = uVar11 - 1;
      }
      if (((long)pbVar9 - (long)value != 0) &&
         (iVar2 = xmlBufAdd(buf,value,(long)pbVar9 - (long)value), iVar2 != 0)) goto LAB_001499e1;
      if (uVar11 < 3) {
        if ((uVar11 == 1) || (pbVar9[1] != 0x23)) goto LAB_001497a2;
LAB_001496f1:
        pbVar9 = pbVar9 + 2;
        iVar2 = 0;
        uVar3 = 0;
        for (iVar12 = uVar11 - 2; 0 < iVar12; iVar12 = iVar12 + -1) {
          uVar3 = (uint)*pbVar9;
          if (uVar3 == 0x3b) goto LAB_0014973f;
          if (9 < (byte)(*pbVar9 - 0x30)) goto LAB_0014973d;
          iVar2 = iVar2 * 10 + uVar3 + -0x30;
          if (0x10ffff < iVar2) {
            iVar2 = 0x110000;
          }
          pbVar9 = pbVar9 + 1;
        }
      }
      else {
        if (pbVar9[1] != 0x23) {
LAB_001497a2:
          value = pbVar9 + 1;
          lVar8 = 0;
LAB_001497a9:
          if ((uVar11 < 2) || (pbVar9[lVar8 + 1] == 0)) {
            pbVar9 = pbVar9 + lVar8 + 1;
LAB_001499c5:
            if (((long)pbVar9 - (long)value == 0) ||
               (iVar2 = xmlBufAdd(buf,value,(long)pbVar9 - (long)value), iVar2 == 0)) {
              iVar2 = xmlBufIsEmpty(buf);
              if (iVar2 == 0) {
                pxVar6 = xmlNewDocText(doc,(xmlChar *)0x0);
                if (pxVar6 == (xmlNodePtr)0x0) {
                  pxVar4 = (xmlChar *)0x0;
                  goto LAB_001499e8;
                }
                pxVar6->parent = parent;
                pxVar4 = xmlBufDetach(buf);
                pxVar6->content = pxVar4;
                pxVar10 = pxVar6;
                if (local_68 != (xmlNodePtr)0x0) {
                  local_68->next = pxVar6;
                  pxVar6->prev = local_68;
                  pxVar10 = local_70;
                }
LAB_00149a99:
                xmlBufFree(buf);
                goto LAB_00149993;
              }
              pxVar6 = local_68;
              pxVar10 = local_70;
              if (local_70 != (xmlNodePtr)0x0) goto LAB_00149a99;
              pxVar6 = xmlNewDocText(doc,"");
              if (pxVar6 != (xmlNodePtr)0x0) {
                pxVar6->parent = parent;
                pxVar10 = pxVar6;
                goto LAB_00149a99;
              }
              local_70 = (xmlNodePtr)0x0;
              goto LAB_00149ab7;
            }
            goto LAB_001499e1;
          }
          if (pbVar9[lVar8 + 1] != 0x3b) goto code_r0x001497c6;
          if (lVar8 != 0) {
            pxVar4 = xmlStrndup(value,(int)lVar8);
            if (pxVar4 == (xmlChar *)0x0) {
LAB_00149ab7:
              pxVar4 = (xmlChar *)0x0;
              goto LAB_001499e8;
            }
            parent_00 = xmlGetDocEntity(doc,pxVar4);
            if ((parent_00 == (xmlEntityPtr)0x0) ||
               (parent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
              iVar2 = xmlBufIsEmpty(buf);
              if (iVar2 == 0) {
                local_50 = xmlNewDocText(doc,(xmlChar *)0x0);
                if (local_50 == (xmlNodePtr)0x0) goto LAB_001499e8;
                pxVar5 = xmlBufDetach(buf);
                local_50->content = pxVar5;
                local_50->parent = parent;
                pxVar6 = local_50;
                if (local_68 != (xmlNodePtr)0x0) {
                  local_68->next = local_50;
                  local_50->prev = local_68;
                  pxVar6 = local_70;
                }
              }
              else {
                local_50 = local_68;
                pxVar6 = local_70;
              }
              local_70 = pxVar6;
              if (((parent_00 != (xmlEntityPtr)0x0) && ((parent_00->flags & 9U) == 0)) &&
                 (parent_00->content != (xmlChar *)0x0)) {
                parent_00->flags = parent_00->flags | 8;
                iVar2 = xmlNodeParseContentInternal
                                  (doc,(xmlNodePtr)parent_00,parent_00->content,-1,(xmlNodePtr *)0x0
                                  );
                uVar7 = parent_00->flags & 0xfffffff7;
                parent_00->flags = uVar7;
                if (iVar2 < 0) goto LAB_001499e8;
                parent_00->flags = uVar7 | 1;
              }
              local_68 = xmlNewEntityRef(doc,pxVar4);
              if (local_68 == (xmlNodePtr)0x0) goto LAB_00149ab7;
              local_68->parent = parent;
              local_68->last = (_xmlNode *)parent_00;
              if (parent_00 != (xmlEntityPtr)0x0) {
                local_68->children = (_xmlNode *)parent_00;
                local_68->content = parent_00->content;
              }
              if (local_50 == (xmlNodePtr)0x0) {
                pxVar4 = (xmlChar *)0x0;
                local_70 = local_68;
              }
              else {
                local_50->next = local_68;
                local_68->prev = local_50;
                pxVar4 = (xmlChar *)0x0;
              }
            }
            else {
              iVar2 = xmlBufCat(buf,parent_00->content);
              if (iVar2 != 0) goto LAB_001499e8;
            }
            (*xmlFree)(pxVar4);
          }
          value = pbVar9 + lVar8 + 2;
          uVar11 = uVar11 - 2;
          goto LAB_00149603;
        }
        if (pbVar9[2] != 0x78) goto LAB_001496f1;
        pbVar9 = pbVar9 + 3;
        iVar2 = 0;
        uVar3 = 0;
        for (iVar12 = uVar11 - 3; 0 < iVar12; iVar12 = iVar12 + -1) {
          bVar1 = *pbVar9;
          uVar3 = (uint)bVar1;
          if (uVar3 == 0x3b) goto LAB_0014973f;
          if ((byte)(bVar1 - 0x30) < 10) {
            iVar2 = iVar2 * 0x10 + uVar3 + -0x30;
          }
          else if ((byte)(bVar1 + 0x9f) < 6) {
            iVar2 = iVar2 * 0x10 + uVar3 + -0x57;
          }
          else {
            if (5 < (byte)(bVar1 + 0xbf)) goto LAB_0014973d;
            iVar2 = iVar2 * 0x10 + uVar3 + -0x37;
          }
          if (0x10ffff < iVar2) {
            iVar2 = 0x110000;
          }
          pbVar9 = pbVar9 + 1;
        }
      }
      iVar12 = 0;
      uVar7 = uVar3;
      goto LAB_0014973f;
    }
    iVar2 = -1;
  }
  return iVar2;
code_r0x001497c6:
  lVar8 = lVar8 + 1;
  uVar11 = uVar11 - 1;
  goto LAB_001497a9;
LAB_0014973d:
  iVar2 = 0;
  uVar7 = uVar3;
LAB_0014973f:
  value = pbVar9 + (uVar7 == 0x3b);
  uVar11 = iVar12 - (uint)(uVar7 == 0x3b);
  if (iVar2 != 0) {
    if (0x10ffff < iVar2) {
      iVar2 = 0xfffd;
    }
    iVar2 = xmlCopyCharMultiByte(buffer,iVar2);
    buffer[iVar2] = '\0';
    iVar2 = xmlBufCat(buf,buffer);
    if (iVar2 != 0) {
LAB_001499e1:
      pxVar4 = (xmlChar *)0x0;
LAB_001499e8:
      xmlBufFree(buf);
      if (pxVar4 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4);
      }
      if (local_70 == (xmlNodePtr)0x0) {
        return -1;
      }
      xmlFreeNodeList(local_70);
      return -1;
    }
  }
  goto LAB_00149603;
}

Assistant:

static int
xmlNodeParseContentInternal(const xmlDoc *doc, xmlNodePtr parent,
                            const xmlChar *value, int len,
                            xmlNodePtr *listPtr) {
    xmlNodePtr head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;
    int remaining;

    if (listPtr != NULL)
        *listPtr = NULL;

    if (len < 0)
        remaining = INT_MAX;
    else
        remaining = len;

    if ((value == NULL) || (value[0] == 0))
        goto done;

    cur = value;

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(-1);

    q = cur;
    while ((remaining > 0) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	        q = cur;
	    }

	    if ((remaining > 2) && (cur[1] == '#') && (cur[2] == 'x')) {
	        int tmp = 0;

		cur += 3;
                remaining -= 3;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else if ((remaining > 1) && (cur[1] == '#')) {
	        int tmp = 0;

		cur += 2;
                remaining -= 2;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
                remaining--;
		q = cur;
		while ((remaining > 0) && (*cur != 0) && (*cur != ';')) {
                    cur++;
                    remaining--;
                }
		if ((remaining <= 0) || (*cur == 0))
		    break;
		if (cur != q) {
		    val = xmlStrndup(q, cur - q);
                    if (val == NULL)
                        goto out;
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
                        /*
                         * Predefined entities don't generate nodes
                         */
			if (xmlBufCat(buf, ent->content))
			    goto out;
		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL)
				goto out;
			    node->content = xmlBufDetach(buf);
                            node->parent = parent;

			    if (last == NULL) {
				head = node;
			    } else {
                                last->next = node;
                                node->prev = last;
			    }
                            last = node;
			}

			if ((ent != NULL) &&
                            ((ent->flags & XML_ENT_PARSED) == 0) &&
                            ((ent->flags & XML_ENT_EXPANDING) == 0) &&
                            (ent->content != NULL)) {
                            int res;

                            ent->flags |= XML_ENT_EXPANDING;
                            res = xmlNodeParseContentInternal(doc,
                                    (xmlNodePtr) ent, ent->content, -1, NULL);
                            ent->flags &= ~XML_ENT_EXPANDING;
                            if (res < 0)
                                goto out;
                            ent->flags |= XML_ENT_PARSED;
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewEntityRef((xmlDocPtr) doc, val);
                        val = NULL;
			if (node == NULL)
			    goto out;
                        node->parent = parent;
                        node->last = (xmlNodePtr) ent;
                        if (ent != NULL) {
                            node->children = (xmlNodePtr) ent;
                            node->content = ent->content;
                        }

			if (last == NULL) {
			    head = node;
			} else {
                            last->next = node;
                            node->prev = last;
			}
                        last = node;
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
                remaining--;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

                if (charval >= 0x110000)
                    charval = 0xFFFD; /* replacement character */

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
	    }
	} else {
	    cur++;
            remaining--;
        }
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL)
            goto out;
        node->parent = parent;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
            last->next = node;
            node->prev = last;
	}
        last = node;
    } else if (head == NULL) {
        head = xmlNewDocText(doc, BAD_CAST "");
        if (head == NULL)
            goto out;
        head->parent = parent;
        last = head;
    }

    xmlBufFree(buf);

done:
    if (parent != NULL) {
        if (parent->children != NULL)
            xmlFreeNodeList(parent->children);
        parent->children = head;
        parent->last = last;
    }

    if (listPtr != NULL)
        *listPtr = head;

    return(0);

out:
    xmlBufFree(buf);
    if (val != NULL)
        xmlFree(val);
    if (head != NULL)
        xmlFreeNodeList(head);
    return(-1);
}